

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  int iVar3;
  char *s1;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  bool bVar11;
  uint uVar12;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  parasail_result_t *result;
  parasail_profile_t *profile_00;
  parasail_result_t *result_00;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *palVar17;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  ulong uVar18;
  ulong uVar19;
  __m256i *palVar20;
  longlong lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  longlong lVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  __m256i *palVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  __m256i *palVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  parasail_result_t *ppVar42;
  ulong uVar43;
  parasail_result_t *ppVar44;
  __m256i *ptr;
  int iVar45;
  __m256i *ptr_00;
  undefined1 auVar46 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar47 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  ulong uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  long lVar107;
  long lVar108;
  undefined1 auVar106 [64];
  undefined4 uVar109;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 uVar110;
  __m256i *palVar111;
  __m256i *ptr_01;
  __m256i *palVar112;
  __m256i *ptr_02;
  __m256i *local_2b0;
  __m256i *local_2a8;
  __m256i *local_2a0;
  __m256i *local_298;
  __m256i *local_290;
  __m256i *local_288;
  __m256i *local_280;
  ulong local_268;
  __m256i *local_228;
  longlong local_218;
  ulong local_158;
  ulong uStack_150;
  ulong uStack_148;
  ulong uStack_140;
  
  s1 = profile->s1;
  ppVar4 = profile->matrix;
  result = parasail_sw_striped_profile_avx2_256_64(profile,s2,s2Len,open,gap);
  iVar13 = parasail_result_is_saturated(result);
  if (iVar13 != 0) {
    return result;
  }
  iVar13 = result->end_query;
  iVar3 = result->end_ref;
  profile_00 = parasail_profile_create_stats_avx_256_64(s1,iVar13 + 1,ppVar4);
  if (profile_00 == (parasail_profile_t *)0x0) {
    parasail_sw_stats_striped_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar5 = (profile_00->profile64).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_stats_striped_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar4 = profile_00->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_striped_profile_avx2_256_64_cold_6();
      }
      else {
        uVar36 = profile_00->s1Len;
        uVar22 = (ulong)uVar36;
        if ((int)uVar36 < 1) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_4();
        }
        else if (iVar3 < 0) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_striped_profile_avx2_256_64_cold_2();
        }
        else {
          if (-1 < gap) {
            pvVar6 = (profile_00->profile64).matches;
            pvVar7 = (profile_00->profile64).similar;
            iVar15 = ppVar4->max;
            result_00 = parasail_result_new_stats();
            ppVar44 = (parasail_result_t *)0x0;
            if (result_00 != (parasail_result_t *)0x0) {
              uVar28 = uVar22 + 3 >> 2;
              result_00->flag = result_00->flag | 0x4810804;
              b = parasail_memalign___m256i(0x20,uVar28);
              local_228 = parasail_memalign___m256i(0x20,uVar28);
              b_00 = parasail_memalign___m256i(0x20,uVar28);
              local_290 = parasail_memalign___m256i(0x20,uVar28);
              b_01 = parasail_memalign___m256i(0x20,uVar28);
              palVar17 = parasail_memalign___m256i(0x20,uVar28);
              b_02 = parasail_memalign___m256i(0x20,uVar28);
              local_298 = parasail_memalign___m256i(0x20,uVar28);
              b_03 = parasail_memalign___m256i(0x20,uVar28);
              b_04 = parasail_memalign___m256i(0x20,uVar28);
              b_05 = parasail_memalign___m256i(0x20,uVar28);
              b_06 = parasail_memalign___m256i(0x20,uVar28);
              local_2a8 = parasail_memalign___m256i(0x20,uVar28);
              local_288 = parasail_memalign___m256i(0x20,uVar28);
              local_2b0 = parasail_memalign___m256i(0x20,uVar28);
              local_2a0 = parasail_memalign___m256i(0x20,uVar28);
              ppVar42 = (parasail_result_t *)0x0;
              ppVar44 = (parasail_result_t *)0x0;
              if ((((((b != (__m256i *)0x0) && (local_228 != (__m256i *)0x0)) &&
                    (ppVar44 = ppVar42, b_00 != (__m256i *)0x0)) &&
                   ((local_290 != (__m256i *)0x0 && (b_01 != (__m256i *)0x0)))) &&
                  (((palVar17 != (__m256i *)0x0 &&
                    ((b_02 != (__m256i *)0x0 && (local_298 != (__m256i *)0x0)))) &&
                   (b_03 != (__m256i *)0x0)))) &&
                 ((((b_04 != (__m256i *)0x0 && (b_05 != (__m256i *)0x0)) && (b_06 != (__m256i *)0x0)
                   ) && (((local_2a8 != (__m256i *)0x0 && (local_288 != (__m256i *)0x0)) &&
                         ((local_2b0 != (__m256i *)0x0 && (local_2a0 != (__m256i *)0x0)))))))) {
                auVar57._4_4_ = 0;
                auVar57._0_4_ = open;
                auVar57._8_4_ = open;
                auVar57._12_4_ = 0;
                auVar57._16_4_ = open;
                auVar57._20_4_ = 0;
                auVar57._24_4_ = open;
                auVar57._28_4_ = 0;
                auVar58._4_4_ = 0;
                auVar58._0_4_ = gap;
                auVar58._8_4_ = gap;
                auVar58._12_4_ = 0;
                auVar58._16_4_ = gap;
                auVar58._20_4_ = 0;
                auVar58._24_4_ = gap;
                auVar58._28_4_ = 0;
                alVar1[0]._4_4_ = in_stack_fffffffffffffd2c;
                alVar1[0]._0_4_ = gap;
                alVar1[1] = (longlong)b_01;
                alVar1[2] = (longlong)b_02;
                alVar1[3] = (longlong)b_00;
                parasail_memset___m256i(b,alVar1,uVar28);
                c[0]._4_4_ = in_stack_fffffffffffffd2c;
                c[0]._0_4_ = gap;
                c[1] = (longlong)b_01;
                c[2] = (longlong)b_02;
                c[3] = (longlong)b_00;
                parasail_memset___m256i(b_00,c,uVar28);
                c_00[0]._4_4_ = in_stack_fffffffffffffd2c;
                c_00[0]._0_4_ = gap;
                c_00[1] = (longlong)b_01;
                c_00[2] = (longlong)b_02;
                c_00[3] = (longlong)b_00;
                parasail_memset___m256i(b_01,c_00,uVar28);
                c_01[0]._4_4_ = in_stack_fffffffffffffd2c;
                c_01[0]._0_4_ = gap;
                c_01[1] = (longlong)b_01;
                c_01[2] = (longlong)b_02;
                c_01[3] = (longlong)b_00;
                parasail_memset___m256i(b_02,c_01,uVar28);
                c_02[0]._4_4_ = in_stack_fffffffffffffd2c;
                c_02[0]._0_4_ = gap;
                c_02[1] = (longlong)b_01;
                c_02[2] = (longlong)b_02;
                c_02[3] = (longlong)b_00;
                parasail_memset___m256i(b_03,c_02,uVar28);
                c_03[0]._4_4_ = in_stack_fffffffffffffd2c;
                c_03[0]._0_4_ = gap;
                c_03[1] = (longlong)b_01;
                c_03[2] = (longlong)b_02;
                c_03[3] = (longlong)b_00;
                parasail_memset___m256i(b_04,c_03,uVar28);
                c_04[0]._4_4_ = in_stack_fffffffffffffd2c;
                c_04[0]._0_4_ = gap;
                c_04[1] = (longlong)b_01;
                c_04[2] = (longlong)b_02;
                c_04[3] = (longlong)b_00;
                parasail_memset___m256i(b_05,c_04,uVar28);
                c_05[0]._4_4_ = in_stack_fffffffffffffd2c;
                c_05[0]._0_4_ = gap;
                c_05[1] = (longlong)b_01;
                c_05[2] = (longlong)b_02;
                c_05[3] = (longlong)b_00;
                parasail_memset___m256i(b_06,c_05,uVar28);
                uVar12 = (uint)uVar28;
                uVar14 = uVar12 - 1;
                uVar43 = 0;
                iVar45 = 0;
                local_218 = 0;
                local_268 = 0xc000000000000000;
                auVar92 = ZEXT1664((undefined1  [16])0x0);
                local_158 = 0;
                uStack_150 = 0;
                uStack_148 = 0;
                uStack_140 = 0;
                auVar89 = ZEXT1664((undefined1  [16])0x0);
                do {
                  palVar112 = b_00;
                  palVar111 = b_02;
                  palVar35 = b;
                  local_280 = b_01;
                  lVar37 = (long)(int)(ppVar4->mapper[(byte)s2[uVar43]] * uVar12) * 0x20;
                  iVar33 = (int)uVar43 + -2;
                  b = local_228;
                  b_01 = palVar17;
                  palVar20 = local_288;
                  palVar30 = local_2a0;
                  b_02 = local_298;
                  b_00 = local_290;
                  if (iVar45 == iVar33) {
                    b = local_2a8;
                    b_01 = local_2b0;
                    palVar20 = local_290;
                    palVar30 = local_298;
                    b_02 = local_2a0;
                    b_00 = local_288;
                  }
                  local_2a0 = palVar30;
                  local_288 = palVar20;
                  alVar1 = palVar111[uVar14];
                  auVar60 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                  auVar102 = vpalignr_avx2((undefined1  [32])alVar1,auVar60,8);
                  alVar1 = local_280[uVar14];
                  auVar60 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                  auVar88 = vpalignr_avx2((undefined1  [32])alVar1,auVar60,8);
                  alVar1 = palVar112[uVar14];
                  auVar60 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                  auVar71 = vpalignr_avx2((undefined1  [32])alVar1,auVar60,8);
                  uVar109 = SUB84(palVar35,0);
                  uVar110 = (undefined4)((ulong)palVar35 >> 0x20);
                  alVar1 = palVar35[uVar14];
                  auVar60 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                  auVar60 = vpalignr_avx2((undefined1  [32])alVar1,auVar60,8);
                  lVar23 = 0;
                  auVar8._8_8_ = 1;
                  auVar8._0_8_ = 1;
                  auVar8._16_8_ = 1;
                  auVar8._24_8_ = 1;
                  auVar72 = ZEXT864(0) << 0x40;
                  auVar73 = ZEXT864(0) << 0x40;
                  auVar90 = ZEXT1664((undefined1  [16])0x0);
                  do {
                    auVar10 = *(undefined1 (*) [32])((long)*b_03 + lVar23);
                    auVar2 = *(undefined1 (*) [32])((long)*b_04 + lVar23);
                    auVar61 = *(undefined1 (*) [32])((long)*b_05 + lVar23);
                    auVar82 = *(undefined1 (*) [32])((long)*b_06 + lVar23);
                    auVar60 = vpaddq_avx2(auVar60,*(undefined1 (*) [32])
                                                   ((long)pvVar5 + lVar23 + lVar37));
                    uVar27 = ~((long)auVar60._0_8_ >> 0x3f) & auVar60._0_8_;
                    uVar18 = vpextrq_avx(auVar60._0_16_,1);
                    uVar18 = ~((long)uVar18 >> 0x3f) & uVar18;
                    uVar39 = ~((long)auVar60._16_8_ >> 0x3f) & auVar60._16_8_;
                    uVar19 = vpextrq_avx(auVar60._16_16_,1);
                    uVar19 = ~((long)uVar19 >> 0x3f) & uVar19;
                    auVar46._8_8_ = 0;
                    auVar46._0_8_ = uVar19;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = uVar39;
                    auVar46 = vpunpcklqdq_avx(auVar47,auVar46);
                    uVar31 = *(ulong *)((long)*b_03 + lVar23);
                    uVar34 = *(ulong *)((long)*b_03 + lVar23 + 8);
                    if ((long)uVar31 < (long)uVar27) {
                      uVar31 = uVar27;
                    }
                    if ((long)uVar34 < (long)uVar18) {
                      uVar34 = uVar18;
                    }
                    uVar32 = *(ulong *)((long)*b_03 + lVar23 + 0x18);
                    uVar24 = *(ulong *)((long)*b_03 + lVar23 + 0x10);
                    if ((long)uVar24 < (long)uVar39) {
                      uVar24 = uVar39;
                    }
                    if ((long)uVar32 < (long)uVar19) {
                      uVar32 = uVar19;
                    }
                    uVar19 = auVar90._0_8_;
                    if ((long)uVar31 <= (long)uVar19) {
                      uVar31 = uVar19;
                    }
                    uVar39 = vpextrq_avx(auVar90._0_16_,1);
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = uVar18;
                    auVar91._8_8_ = 0;
                    auVar91._0_8_ = uVar27;
                    auVar47 = vpunpcklqdq_avx(auVar91,auVar62);
                    if ((long)uVar34 <= (long)uVar39) {
                      uVar34 = uVar39;
                    }
                    auVar47 = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar47;
                    auVar46 = ZEXT116(1) * auVar46;
                    uVar18 = auVar90._16_8_;
                    if ((long)uVar24 <= (long)uVar18) {
                      uVar24 = uVar18;
                    }
                    uVar27 = vpextrq_avx(auVar90._16_16_,1);
                    if ((long)uVar32 <= (long)uVar27) {
                      uVar32 = uVar27;
                    }
                    auVar63._8_8_ = 0;
                    auVar63._0_8_ = uVar32;
                    auVar103._8_8_ = 0;
                    auVar103._0_8_ = uVar24;
                    auVar62 = vpunpcklqdq_avx(auVar103,auVar63);
                    auVar100._8_8_ = 0;
                    auVar100._0_8_ = uVar31;
                    auVar104._8_8_ = 0;
                    auVar104._0_8_ = uVar34;
                    auVar91 = vpunpcklqdq_avx(auVar100,auVar104);
                    auVar105._0_16_ = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar91;
                    auVar62 = ZEXT116(1) * auVar62;
                    auVar105._16_16_ = auVar62;
                    *(undefined1 (*) [32])((long)*b + lVar23) = auVar105;
                    uVar27 = auVar105._0_8_;
                    auVar59._0_8_ = -(ulong)(uVar27 == auVar47._0_8_);
                    lVar107 = auVar105._8_8_;
                    auVar59._8_8_ = -(ulong)(lVar107 == auVar47._8_8_);
                    uVar39 = auVar62._0_8_;
                    auVar59._16_8_ = -(ulong)(uVar39 == auVar46._0_8_);
                    lVar108 = auVar62._8_8_;
                    auVar59._24_8_ = -(ulong)(lVar108 == auVar46._8_8_);
                    auVar101._0_8_ = -(ulong)(uVar27 == uVar19);
                    auVar101._8_8_ = -(ulong)(lVar107 == auVar90._8_8_);
                    auVar101._16_8_ = -(ulong)(uVar39 == uVar18);
                    auVar101._24_8_ = -(ulong)(lVar108 == auVar90._24_8_);
                    auVar60 = vblendvpd_avx(auVar2,auVar73._0_32_,auVar101);
                    auVar71 = vpaddq_avx2(auVar71,*(undefined1 (*) [32])
                                                   ((long)pvVar6 + lVar23 + lVar37));
                    auVar60 = vblendvpd_avx(auVar60,auVar71,auVar59);
                    auVar70._0_8_ = -(ulong)(uVar27 == 0);
                    auVar70._8_8_ = -(ulong)(lVar107 == 0);
                    auVar70._16_8_ = -(ulong)(uVar39 == 0);
                    auVar70._24_8_ = -(ulong)(lVar108 == 0);
                    auVar9 = vpandn_avx2(auVar70,auVar60);
                    *(undefined1 (*) [32])((long)*b_00 + lVar23) = auVar9;
                    auVar60 = vblendvpd_avx(auVar61,auVar72._0_32_,auVar101);
                    auVar71 = vpaddq_avx2(auVar88,*(undefined1 (*) [32])
                                                   ((long)pvVar7 + lVar23 + lVar37));
                    auVar60 = vblendvpd_avx(auVar60,auVar71,auVar59);
                    auVar71 = vblendvpd_avx(auVar82,auVar8,auVar101);
                    auVar88 = vpcmpeqd_avx2(auVar8,auVar8);
                    auVar88 = vpsubq_avx2(auVar102,auVar88);
                    auVar71 = vblendvpd_avx(auVar71,auVar88,auVar59);
                    uVar18 = auVar9._0_8_;
                    if ((long)auVar9._0_8_ < (long)auVar92._0_8_) {
                      uVar18 = auVar92._0_8_;
                    }
                    uVar27 = vpextrq_avx(auVar92._0_16_,1);
                    uVar19 = vpextrq_avx(auVar9._0_16_,1);
                    if ((long)uVar19 < (long)uVar27) {
                      uVar19 = uVar27;
                    }
                    uVar27 = auVar9._16_8_;
                    if ((long)auVar9._16_8_ < (long)auVar92._16_8_) {
                      uVar27 = auVar92._16_8_;
                    }
                    uVar40 = vpextrq_avx(auVar92._16_16_,1);
                    auVar60 = vpandn_avx2(auVar70,auVar60);
                    uVar39 = vpextrq_avx(auVar9._16_16_,1);
                    if ((long)uVar39 < (long)uVar40) {
                      uVar39 = uVar40;
                    }
                    if ((long)uVar18 <= (long)auVar60._0_8_) {
                      uVar18 = auVar60._0_8_;
                    }
                    uVar40 = vpextrq_avx(auVar60._0_16_,1);
                    if ((long)uVar19 <= (long)uVar40) {
                      uVar19 = uVar40;
                    }
                    if ((long)uVar27 <= (long)auVar60._16_8_) {
                      uVar27 = auVar60._16_8_;
                    }
                    auVar71 = vpandn_avx2(auVar70,auVar71);
                    uVar40 = vpextrq_avx(auVar60._16_16_,1);
                    if ((long)uVar39 <= (long)uVar40) {
                      uVar39 = uVar40;
                    }
                    if ((long)uVar18 <= (long)auVar71._0_8_) {
                      uVar18 = auVar71._0_8_;
                    }
                    uVar40 = vpextrq_avx(auVar71._0_16_,1);
                    if ((long)uVar19 <= (long)uVar40) {
                      uVar19 = uVar40;
                    }
                    if ((long)uVar27 <= (long)auVar71._16_8_) {
                      uVar27 = auVar71._16_8_;
                    }
                    uVar40 = vpextrq_avx(auVar71._16_16_,1);
                    if ((long)uVar39 <= (long)uVar40) {
                      uVar39 = uVar40;
                    }
                    if ((long)uVar31 <= (long)auVar89._0_8_) {
                      uVar31 = auVar89._0_8_;
                    }
                    uVar40 = vpextrq_avx(auVar89._0_16_,1);
                    if ((long)uVar34 <= (long)uVar40) {
                      uVar34 = uVar40;
                    }
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = uVar39;
                    auVar64._8_8_ = 0;
                    auVar64._0_8_ = uVar27;
                    auVar46 = vpunpcklqdq_avx(auVar64,auVar48);
                    if ((long)uVar24 <= (long)auVar89._16_8_) {
                      uVar24 = auVar89._16_8_;
                    }
                    uVar27 = vpextrq_avx(auVar89._16_16_,1);
                    if ((long)uVar32 <= (long)uVar27) {
                      uVar32 = uVar27;
                    }
                    auVar88 = vpsubq_avx2(auVar105,auVar57);
                    auVar102 = vpsubq_avx2(auVar10,auVar58);
                    uVar39 = auVar88._0_8_;
                    uVar27 = auVar102._0_8_;
                    if ((long)auVar102._0_8_ < (long)uVar39) {
                      uVar27 = uVar39;
                    }
                    uVar29 = vpextrq_avx(auVar88._0_16_,1);
                    uVar40 = vpextrq_avx(auVar102._0_16_,1);
                    if ((long)uVar40 < (long)uVar29) {
                      uVar40 = uVar29;
                    }
                    uVar93 = auVar88._16_8_;
                    uVar41 = vpextrq_avx(auVar88._16_16_,1);
                    uVar38 = auVar102._16_8_;
                    if ((long)auVar102._16_8_ < (long)uVar93) {
                      uVar38 = uVar93;
                    }
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = uVar18;
                    auVar83._8_8_ = 0;
                    auVar83._0_8_ = uVar19;
                    auVar47 = vpunpcklqdq_avx(auVar49,auVar83);
                    uVar18 = vpextrq_avx(auVar102._16_16_,1);
                    if ((long)uVar18 < (long)uVar41) {
                      uVar18 = uVar41;
                    }
                    auVar92 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar46,
                                                  ZEXT116(0) * auVar46 + ZEXT116(1) * auVar47));
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = uVar40;
                    auVar94._8_8_ = 0;
                    auVar94._0_8_ = uVar27;
                    auVar46 = vpunpcklqdq_avx(auVar94,auVar84);
                    *(undefined1 (*) [32])((long)*b_01 + lVar23) = auVar60;
                    *(undefined1 (*) [32])((long)*b_02 + lVar23) = auVar71;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = uVar18;
                    auVar85._8_8_ = 0;
                    auVar85._0_8_ = uVar38;
                    auVar47 = vpunpcklqdq_avx(auVar85,auVar50);
                    auVar10 = vpcmpgtq_avx2(auVar88,auVar102);
                    auVar102 = vblendvpd_avx(auVar2,auVar9,auVar10);
                    auVar2 = vblendvpd_avx(auVar61,auVar60,auVar10);
                    auVar61 = vpcmpeqd_avx2(ZEXT832(uVar27),ZEXT832(uVar27));
                    auVar82 = vpsubq_avx2(auVar82,auVar61);
                    auVar59 = vpsubq_avx2(auVar71,auVar61);
                    auVar61 = vpcmpeqd_avx2(auVar71,auVar71);
                    auVar71 = vblendvpd_avx(auVar82,auVar59,auVar10);
                    *(undefined1 (*) [16])((long)*b_03 + lVar23 + 0x10) = auVar47;
                    *(undefined1 (*) [16])((long)*b_03 + lVar23) = auVar46;
                    auVar51._8_8_ = 0;
                    auVar51._0_8_ = uVar32;
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar24;
                    auVar46 = vpunpcklqdq_avx(auVar97,auVar51);
                    *(undefined1 (*) [32])((long)*b_04 + lVar23) = auVar102;
                    auVar102 = vpsubq_avx2(auVar90._0_32_,auVar58);
                    uVar18 = auVar102._0_8_;
                    if ((long)auVar102._0_8_ < (long)uVar39) {
                      uVar18 = uVar39;
                    }
                    uVar19 = vpextrq_avx(auVar102._0_16_,1);
                    auVar74._8_8_ = 0;
                    auVar74._0_8_ = uVar31;
                    auVar98._8_8_ = 0;
                    auVar98._0_8_ = uVar34;
                    auVar47 = vpunpcklqdq_avx(auVar74,auVar98);
                    uVar31 = vpextrq_avx(auVar102._16_16_,1);
                    if ((long)uVar19 < (long)uVar29) {
                      uVar19 = uVar29;
                    }
                    uVar34 = auVar102._16_8_;
                    if ((long)auVar102._16_8_ < (long)uVar93) {
                      uVar34 = uVar93;
                    }
                    if ((long)uVar31 < (long)uVar41) {
                      uVar31 = uVar41;
                    }
                    *(undefined1 (*) [32])((long)*b_05 + lVar23) = auVar2;
                    *(undefined1 (*) [32])((long)*b_06 + lVar23) = auVar71;
                    auVar89 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar46,
                                                  ZEXT116(0) * auVar46 + ZEXT116(1) * auVar47));
                    auVar65._8_8_ = 0;
                    auVar65._0_8_ = uVar31;
                    auVar99._8_8_ = 0;
                    auVar99._0_8_ = uVar34;
                    auVar46 = vpunpcklqdq_avx(auVar99,auVar65);
                    auVar52._8_8_ = 0;
                    auVar52._0_8_ = uVar19;
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar18;
                    auVar47 = vpunpcklqdq_avx(auVar75,auVar52);
                    auVar88 = vpcmpgtq_avx2(auVar88,auVar102);
                    auVar71 = vblendvpd_avx(auVar73._0_32_,auVar9,auVar88);
                    auVar73 = ZEXT3264(auVar71);
                    auVar90 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar46,
                                                  ZEXT116(0) * auVar46 + ZEXT116(1) * auVar47));
                    auVar60 = vblendvpd_avx(auVar72._0_32_,auVar60,auVar88);
                    auVar72 = ZEXT3264(auVar60);
                    auVar60 = vpsubq_avx2(auVar8,auVar61);
                    auVar8 = vblendvpd_avx(auVar60,auVar59,auVar88);
                    auVar60 = *(undefined1 (*) [32])((long)*palVar35 + lVar23);
                    auVar71 = *(undefined1 (*) [32])((long)*palVar112 + lVar23);
                    auVar88 = *(undefined1 (*) [32])((long)*local_280 + lVar23);
                    auVar102 = *(undefined1 (*) [32])((long)*palVar111 + lVar23);
                    lVar23 = lVar23 + 0x20;
                  } while (uVar28 << 5 != lVar23);
                  if (iVar45 == iVar33) {
                    local_2a8 = local_228;
                    local_2b0 = palVar17;
                  }
                  iVar33 = 0;
                  auVar106 = ZEXT3264(auVar8);
                  do {
                    auVar60 = vpermpd_avx2(auVar106._0_32_,0x90);
                    auVar60 = vblendpd_avx(auVar60,SUB6432(ZEXT864(1),0),1);
                    auVar106 = ZEXT3264(auVar60);
                    auVar71 = auVar72._0_32_;
                    auVar60 = vperm2f128_avx(auVar71,auVar71,8);
                    auVar60 = vpalignr_avx2(auVar71,auVar60,8);
                    auVar72 = ZEXT3264(auVar60);
                    auVar71 = auVar73._0_32_;
                    auVar60 = vperm2f128_avx(auVar71,auVar71,8);
                    auVar60 = vpalignr_avx2(auVar71,auVar60,8);
                    auVar73 = ZEXT3264(auVar60);
                    auVar60 = vpermq_avx2(auVar90._0_32_,0x90);
                    auVar60 = vpblendd_avx2(auVar60,ZEXT832((ulong)(long)-open),3);
                    auVar90 = ZEXT3264(auVar60);
                    alVar1 = palVar35[uVar14];
                    auVar60 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,8);
                    auVar60 = vpalignr_avx2((undefined1  [32])alVar1,auVar60,8);
                    lVar23 = 0;
                    auVar95 = ZEXT3264(auVar60);
                    do {
                      auVar60 = vpaddq_avx2(auVar95._0_32_,
                                            *(undefined1 (*) [32])((long)pvVar5 + lVar23 + lVar37));
                      uVar31 = vpextrq_avx(auVar60._0_16_,1);
                      uVar34 = vpextrq_avx(auVar60._16_16_,1);
                      auVar53._8_8_ = 0;
                      auVar53._0_8_ = ~((long)uVar34 >> 0x3f) & uVar34;
                      auVar66._8_8_ = 0;
                      auVar66._0_8_ = ~((long)auVar60._16_8_ >> 0x3f) & auVar60._16_8_;
                      auVar46 = vpunpcklqdq_avx(auVar66,auVar53);
                      auVar67._8_8_ = 0;
                      auVar67._0_8_ = ~((long)uVar31 >> 0x3f) & uVar31;
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ = ~((long)auVar60._0_8_ >> 0x3f) & auVar60._0_8_;
                      auVar47 = vpunpcklqdq_avx(auVar76,auVar67);
                      uVar18 = auVar90._0_8_;
                      uVar31 = *(ulong *)((long)*b + lVar23);
                      uVar34 = uVar18;
                      if ((long)uVar18 < (long)uVar31) {
                        uVar34 = uVar31;
                      }
                      uVar19 = vpextrq_avx(auVar90._0_16_,1);
                      uVar31 = *(ulong *)((long)*b + lVar23 + 8);
                      if ((long)uVar19 < (long)uVar31) {
                        uVar19 = uVar31;
                      }
                      uVar31 = *(ulong *)((long)*b + lVar23 + 0x10);
                      uVar39 = auVar90._16_8_;
                      uVar27 = uVar39;
                      if ((long)uVar39 < (long)uVar31) {
                        uVar27 = uVar31;
                      }
                      uVar32 = vpextrq_avx(auVar90._16_16_,1);
                      uVar31 = *(ulong *)((long)*b + lVar23 + 0x18);
                      if ((long)uVar32 < (long)uVar31) {
                        uVar32 = uVar31;
                      }
                      auVar96._0_16_ = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar47;
                      auVar46 = ZEXT116(1) * auVar46;
                      auVar96._32_32_ = auVar95._32_32_;
                      auVar96._16_16_ = auVar46;
                      auVar54._8_8_ = 0;
                      auVar54._0_8_ = uVar32;
                      auVar68._8_8_ = 0;
                      auVar68._0_8_ = uVar27;
                      auVar47 = vpunpcklqdq_avx(auVar68,auVar54);
                      auVar69._8_8_ = 0;
                      auVar69._0_8_ = uVar19;
                      auVar77._8_8_ = 0;
                      auVar77._0_8_ = uVar34;
                      auVar62 = vpunpcklqdq_avx(auVar77,auVar69);
                      auVar102._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar62;
                      auVar47 = ZEXT116(1) * auVar47;
                      auVar102._16_16_ = auVar47;
                      *(undefined1 (*) [32])((long)*b + lVar23) = auVar102;
                      auVar60._0_8_ = -(ulong)(auVar102._0_8_ == uVar18);
                      auVar60._8_8_ = -(ulong)(auVar102._8_8_ == auVar90._8_8_);
                      auVar60._16_8_ = -(ulong)(auVar47._0_8_ == uVar39);
                      auVar60._24_8_ = -(ulong)(auVar47._8_8_ == auVar90._24_8_);
                      auVar71._0_8_ = -(ulong)(auVar102._0_8_ == auVar96._0_8_);
                      auVar71._8_8_ = -(ulong)(auVar102._8_8_ == auVar96._8_8_);
                      auVar71._16_8_ = -(ulong)(auVar47._0_8_ == auVar46._0_8_);
                      auVar71._24_8_ = -(ulong)(auVar47._8_8_ == auVar46._8_8_);
                      auVar88 = vpandn_avx2(auVar71,auVar60);
                      auVar60 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_00 + lVar23),
                                              auVar73._0_32_,auVar88);
                      *(undefined1 (*) [32])((long)*b_00 + lVar23) = auVar60;
                      auVar71 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_01 + lVar23),
                                              auVar72._0_32_,auVar88);
                      *(undefined1 (*) [32])((long)*b_01 + lVar23) = auVar71;
                      auVar88 = vblendvpd_avx(*(undefined1 (*) [32])((long)*b_02 + lVar23),
                                              auVar106._0_32_,auVar88);
                      *(undefined1 (*) [32])((long)*b_02 + lVar23) = auVar88;
                      uVar31 = auVar60._0_8_;
                      if ((long)auVar60._0_8_ < (long)auVar92._0_8_) {
                        uVar31 = auVar92._0_8_;
                      }
                      uVar39 = vpextrq_avx(auVar92._0_16_,1);
                      uVar18 = vpextrq_avx(auVar60._0_16_,1);
                      if ((long)uVar18 < (long)uVar39) {
                        uVar18 = uVar39;
                      }
                      uVar39 = auVar60._16_8_;
                      if ((long)auVar60._16_8_ < (long)auVar92._16_8_) {
                        uVar39 = auVar92._16_8_;
                      }
                      uVar40 = vpextrq_avx(auVar92._16_16_,1);
                      uVar24 = vpextrq_avx(auVar60._16_16_,1);
                      if ((long)uVar24 < (long)uVar40) {
                        uVar24 = uVar40;
                      }
                      if ((long)uVar31 <= (long)auVar71._0_8_) {
                        uVar31 = auVar71._0_8_;
                      }
                      uVar40 = vpextrq_avx(auVar71._0_16_,1);
                      if ((long)uVar18 <= (long)uVar40) {
                        uVar18 = uVar40;
                      }
                      if ((long)uVar39 <= (long)auVar71._16_8_) {
                        uVar39 = auVar71._16_8_;
                      }
                      uVar40 = vpextrq_avx(auVar71._16_16_,1);
                      if ((long)uVar24 <= (long)uVar40) {
                        uVar24 = uVar40;
                      }
                      if ((long)uVar31 <= (long)auVar88._0_8_) {
                        uVar31 = auVar88._0_8_;
                      }
                      uVar40 = vpextrq_avx(auVar88._0_16_,1);
                      if ((long)uVar18 <= (long)uVar40) {
                        uVar18 = uVar40;
                      }
                      if ((long)uVar39 <= (long)auVar88._16_8_) {
                        uVar39 = auVar88._16_8_;
                      }
                      uVar40 = vpextrq_avx(auVar88._16_16_,1);
                      if ((long)uVar24 <= (long)uVar40) {
                        uVar24 = uVar40;
                      }
                      if ((long)uVar34 <= (long)auVar89._0_8_) {
                        uVar34 = auVar89._0_8_;
                      }
                      uVar40 = vpextrq_avx(auVar89._0_16_,1);
                      if ((long)uVar19 <= (long)uVar40) {
                        uVar19 = uVar40;
                      }
                      if ((long)uVar27 <= (long)auVar89._16_8_) {
                        uVar27 = auVar89._16_8_;
                      }
                      uVar40 = vpextrq_avx(auVar89._16_16_,1);
                      if ((long)uVar32 <= (long)uVar40) {
                        uVar32 = uVar40;
                      }
                      auVar2 = vpsubq_avx2(auVar102,auVar57);
                      auVar61 = vpsubq_avx2(auVar90._0_32_,auVar58);
                      auVar8 = vpcmpgtq_avx2(auVar61,auVar2);
                      auVar82._0_8_ = -(ulong)(auVar61._0_8_ == auVar2._0_8_);
                      auVar82._8_8_ = -(ulong)(auVar61._8_8_ == auVar2._8_8_);
                      auVar82._16_8_ = -(ulong)(auVar61._16_8_ == auVar2._16_8_);
                      auVar82._24_8_ = -(ulong)(auVar61._24_8_ == auVar2._24_8_);
                      auVar102 = vpcmpgtq_avx2(auVar61,_DAT_008d4700);
                      auVar102 = vpand_avx2(auVar82,auVar102);
                      auVar102 = vpor_avx2(auVar102,auVar8);
                      if ((((auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           SUB321(auVar102 >> 0x7f,0) == '\0') && SUB321(auVar102 >> 0xbf,0) == '\0'
                          ) && -1 < auVar102[0x1f]) {
                        iVar16 = 0x1e;
                      }
                      else {
                        auVar8 = vpcmpgtq_avx2(auVar2,auVar61);
                        auVar60 = vblendvpd_avx(auVar73._0_32_,auVar60,auVar8);
                        auVar73 = ZEXT3264(auVar60);
                        auVar60 = vblendvpd_avx(auVar72._0_32_,auVar71,auVar8);
                        auVar72 = ZEXT3264(auVar60);
                        auVar60 = vblendvpd_avx(auVar106._0_32_,auVar88,auVar8);
                        auVar60 = vpsubq_avx2(auVar60,_DAT_008d4ac0);
                        auVar106 = ZEXT3264(auVar60);
                        auVar96 = ZEXT3264(*(undefined1 (*) [32])((long)*palVar35 + lVar23));
                        iVar16 = 0;
                        auVar90 = ZEXT3264(auVar61);
                      }
                      auVar55._8_8_ = 0;
                      auVar55._0_8_ = uVar24;
                      auVar78._8_8_ = 0;
                      auVar78._0_8_ = uVar39;
                      auVar46 = vpunpcklqdq_avx(auVar78,auVar55);
                      auVar79._8_8_ = 0;
                      auVar79._0_8_ = uVar18;
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = uVar31;
                      auVar47 = vpunpcklqdq_avx(auVar86,auVar79);
                      auVar91 = ZEXT116(0) * auVar46 + ZEXT116(1) * auVar47;
                      auVar46 = ZEXT116(1) * auVar46;
                      auVar92 = ZEXT3264(CONCAT1616(auVar46,auVar91));
                      auVar56._8_8_ = 0;
                      auVar56._0_8_ = uVar32;
                      auVar80._8_8_ = 0;
                      auVar80._0_8_ = uVar27;
                      auVar47 = vpunpcklqdq_avx(auVar80,auVar56);
                      auVar81._8_8_ = 0;
                      auVar81._0_8_ = uVar19;
                      auVar87._8_8_ = 0;
                      auVar87._0_8_ = uVar34;
                      auVar62 = vpunpcklqdq_avx(auVar87,auVar81);
                      auVar88._0_16_ = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar62;
                      auVar88._16_16_ = ZEXT116(1) * auVar47;
                      auVar89 = ZEXT3264(auVar88);
                      if ((((((((((((((((((((((((((((((((auVar102 >> 7 & (undefined1  [32])0x1) ==
                                                        (undefined1  [32])0x0 &&
                                                       (auVar102 >> 0xf & (undefined1  [32])0x1) ==
                                                       (undefined1  [32])0x0) &&
                                                      (auVar102 >> 0x17 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0) &&
                                                     (auVar102 >> 0x1f & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar102 >> 0x27 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar102 >> 0x2f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar102 >> 0x37 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar102 >> 0x3f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar102 >> 0x47 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar102 >> 0x4f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar102 >> 0x57 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar102 >> 0x5f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar102 >> 0x67 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar102 >> 0x6f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar102 >> 0x77 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         SUB321(auVar102 >> 0x7f,0) == '\0') &&
                                        (auVar102 >> 0x87 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (auVar102 >> 0x8f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar102 >> 0x97 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar102 >> 0x9f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar102 >> 0xa7 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar102 >> 0xaf & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar102 >> 0xb7 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar102 >> 0xbf,0) == '\0') &&
                                (auVar102 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar102 >> 0xcf & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar102 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar102 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar102 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (auVar102 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                          && (auVar102 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          -1 < auVar102[0x1f]) goto LAB_0077260f;
                      lVar23 = lVar23 + 0x20;
                      auVar95 = auVar96;
                    } while (uVar28 << 5 != lVar23);
                    iVar16 = 0;
LAB_0077260f:
                    iVar26 = iVar45;
                    uVar31 = local_158;
                    uVar18 = uStack_150;
                    uVar39 = uStack_148;
                    uVar24 = uStack_140;
                    if (iVar16 != 0) {
                      if (iVar16 != 0x1e) {
                        bVar11 = false;
                        goto LAB_007726a2;
                      }
                      break;
                    }
                    iVar33 = iVar33 + 1;
                  } while (iVar33 != 4);
                  auVar2._8_8_ = uStack_150;
                  auVar2._0_8_ = local_158;
                  auVar2._16_8_ = uStack_148;
                  auVar2._24_8_ = uStack_140;
                  auVar60 = vpcmpgtq_avx2(auVar88,auVar2);
                  bVar11 = true;
                  if ((((auVar60 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar60 >> 0x7f,0) != '\0') || SUB321(auVar60 >> 0xbf,0) != '\0') ||
                      auVar60[0x1f] < '\0') {
                    if ((long)uVar34 < (long)uVar27) {
                      uVar34 = uVar27;
                    }
                    if ((long)uVar19 < (long)uVar32) {
                      uVar19 = uVar32;
                    }
                    local_268 = uVar19;
                    if ((long)uVar19 <= (long)uVar34) {
                      local_268 = uVar34;
                    }
                    iVar26 = (int)uVar43;
                    uVar31 = local_268;
                    uVar18 = local_268;
                    uVar39 = local_268;
                    uVar24 = local_268;
                    if ((long)(~(long)iVar15 + 0x7fffffffffffffffU) < (long)local_268) {
                      *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                      bVar11 = false;
                      iVar26 = iVar45;
                      uVar31 = local_158;
                      uVar18 = uStack_150;
                      uVar39 = uStack_148;
                      uVar24 = uStack_140;
                    }
                  }
LAB_007726a2:
                  uStack_140 = uVar24;
                  uStack_148 = uVar39;
                  uStack_150 = uVar18;
                  local_158 = uVar31;
                  iVar45 = iVar26;
                  local_298 = palVar111;
                  local_290 = palVar112;
                  if (!bVar11) goto LAB_007726d2;
                  uVar43 = uVar43 + 1;
                  palVar17 = local_280;
                  local_228 = palVar35;
                } while (uVar43 != iVar3 + 1U);
                uVar43 = (ulong)(iVar3 + 1U);
LAB_007726d2:
                if ((local_268 == 0x7fffffffffffffff) ||
                   (auVar61._0_8_ = -(ulong)(auVar91._0_8_ == 0x7fffffffffffffff),
                   auVar61._8_8_ = -(ulong)(auVar91._8_8_ == 0x7fffffffffffffff),
                   auVar61._16_8_ = -(ulong)(auVar46._0_8_ == 0x7fffffffffffffff),
                   bVar11 = auVar46._8_8_ == 0x7fffffffffffffff, auVar61._24_8_ = -(ulong)bVar11,
                   (((auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    SUB321(auVar61 >> 0x7f,0) != '\0') || SUB321(auVar61 >> 0xbf,0) != '\0') ||
                   bVar11)) {
                  *(byte *)&result_00->flag = (byte)result_00->flag | 0x40;
                }
                iVar15 = parasail_result_is_saturated(result_00);
                iVar33 = 0;
                if (iVar15 == 0) {
                  palVar20 = local_2b0;
                  palVar30 = b_01;
                  palVar35 = b_02;
                  ptr = local_2a8;
                  ptr_00 = b_00;
                  palVar17 = b;
                  ptr_01 = local_2a0;
                  ptr_02 = local_288;
                  if ((iVar45 != (int)uVar43 + -1) &&
                     (palVar20 = b_01, palVar30 = local_2b0, palVar35 = local_2a0, ptr = b,
                     ptr_00 = local_288, palVar17 = local_2a8, ptr_01 = b_02, ptr_02 = b_00,
                     iVar45 == (int)uVar43 + -2)) {
                    palVar17 = (__m256i *)CONCAT44(uVar110,uVar109);
                    uVar109 = SUB84(local_2a8,0);
                    uVar110 = (undefined4)((ulong)local_2a8 >> 0x20);
                    palVar30 = local_280;
                    palVar35 = palVar111;
                    ptr_00 = palVar112;
                    local_298 = local_2a0;
                    local_290 = local_288;
                    local_280 = local_2b0;
                  }
                  lVar25 = 0;
                  if ((uVar22 + 3 & 0x7ffffffc) == 0) {
                    iVar33 = 0;
                    iVar16 = 0;
                    iVar15 = 0;
                  }
                  else {
                    uVar28 = 0;
                    lVar21 = 0;
                    do {
                      if (((*palVar17)[uVar28] == local_268) &&
                         (uVar36 = ((uint)uVar28 & 3) * uVar12 + ((uint)(uVar28 >> 2) & 0x3fffffff),
                         (int)uVar36 < (int)uVar22)) {
                        local_218 = (*ptr_00)[uVar28];
                        lVar25 = (*palVar30)[uVar28];
                        lVar21 = (*palVar35)[uVar28];
                        uVar22 = (ulong)uVar36;
                      }
                      iVar16 = (int)lVar21;
                      iVar33 = (int)lVar25;
                      uVar36 = (uint)uVar22;
                      uVar28 = uVar28 + 1;
                    } while ((uVar12 & 0x1fffffff) << 2 != (int)uVar28);
                    iVar15 = (int)local_218;
                  }
                  iVar26 = (int)local_268;
                }
                else {
                  iVar16 = 0;
                  iVar15 = 0;
                  iVar26 = 0;
                  iVar45 = 0;
                  uVar36 = 0;
                  palVar30 = local_2b0;
                  palVar35 = local_2a0;
                  ptr = b;
                  ptr_00 = local_288;
                  palVar17 = local_2a8;
                  palVar20 = b_01;
                  ptr_01 = b_02;
                  ptr_02 = b_00;
                }
                result_00->score = iVar26;
                result_00->end_query = uVar36;
                result_00->end_ref = iVar45;
                ((result_00->field_4).stats)->matches = iVar15;
                ((result_00->field_4).stats)->similar = iVar33;
                ((result_00->field_4).stats)->length = iVar16;
                parasail_free(palVar35);
                parasail_free(palVar30);
                parasail_free(ptr_00);
                parasail_free(palVar17);
                parasail_free(b_06);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(local_298);
                parasail_free(ptr_01);
                parasail_free(local_280);
                parasail_free(palVar20);
                parasail_free(local_290);
                parasail_free(ptr_02);
                parasail_free((void *)CONCAT44(uVar110,uVar109));
                parasail_free(ptr);
                ppVar44 = result_00;
              }
            }
            goto LAB_00772981;
          }
          parasail_sw_stats_striped_profile_avx2_256_64_cold_1();
        }
      }
    }
  }
  ppVar44 = (parasail_result_t *)0x0;
LAB_00772981:
  parasail_profile_free(profile_00);
  parasail_result_free(result);
  ppVar44->end_query = iVar13;
  ppVar44->end_ref = iVar3;
  return ppVar44;
}

Assistant:

parasail_result_t* INAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;

    /* find the end loc first with the faster implementation */
    parasail_result_t *result = parasail_sw_striped_profile_avx2_256_64(profile, s2, s2Len, open, gap);
    if (!parasail_result_is_saturated(result)) {
#if 0
        int s1Len_new = 0;
        int s2Len_new = 0;
        char *s1_new = NULL;
        char *s2_new = NULL;
        parasail_profile_t *profile_new = NULL;
        parasail_result_t *result_new = NULL;
        int s1_begin = 0;
        int s2_begin = 0;
        int s1Len_final = 0;
        int s2Len_final = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc and the non-stats version of the function,
         * reverse the inputs and find the beg loc */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        s1_new = parasail_reverse(s1, s1Len_new);
        s2_new = parasail_reverse(s2, s2Len_new);
        profile_new = parasail_profile_create_avx_256_64(
                s1_new, s1Len_new, matrix);
        profile_new->stop = result->score;
        result_new = parasail_sw_striped_profile_avx2_256_64(
                profile_new, s2_new, s2Len_new, open, gap);

        /* using both the beg and end loc, call the original stats func */
        s1_begin = s1Len_new - result_new->end_query - 1;
        s2_begin = s2Len_new - result_new->end_ref - 1;
        s1Len_final = s1Len_new - s1_begin;
        s2Len_final = s2Len_new - s2_begin;
        assert(s1_begin >= 0);
        assert(s2_begin >= 0);
        assert(s1Len_new > s1_begin);
        assert(s2Len_new > s2_begin);
        profile_final = parasail_profile_create_stats_avx_256_64(
                &s1[s1_begin], s1Len_final, matrix);
        result_final = PNAME(
                profile_final, &s2[s2_begin], s2Len_final, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        free(s1_new);
        free(s2_new);
        parasail_profile_free(profile_new);
        parasail_profile_free(profile_final);
        parasail_result_free(result);
        parasail_result_free(result_new);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#else
        int s1Len_new = 0;
        int s2Len_new = 0;
        parasail_profile_t *profile_final = NULL;
        parasail_result_t *result_final = NULL;

        /* using the end loc, call the original stats function */
        s1Len_new = result->end_query+1;
        s2Len_new = result->end_ref+1;
        profile_final = parasail_profile_create_stats_avx_256_64(
                s1, s1Len_new, matrix);
        result_final = PNAME(
                profile_final, s2, s2Len_new, open, gap);

        /* clean up all the temporary profiles, sequences, and results */
        parasail_profile_free(profile_final);
        parasail_result_free(result);

        /* correct the end locations before returning */
        result_final->end_query = s1Len_new-1;
        result_final->end_ref = s2Len_new-1;
        return result_final;
#endif
    }
    else {
        return result;
    }
}